

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M2L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer ppVar6;
  iterator __position;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined8 uVar39;
  double *pdVar40;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar41;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  ostream *poVar42;
  long lVar43;
  undefined8 *puVar44;
  char *__function;
  long lVar45;
  pointer pMVar46;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar47;
  iterator iVar48;
  ulong uVar49;
  byte bVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  uint uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  vector<double,_std::allocator<double>_> realRoots;
  double tz;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  trans;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines3;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines2;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_3,_1,_0,_3,_1> t;
  Matrix<double,_3,_3,_0,_3,_3> R;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_4,_4,_0,_4,_4> Tw;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  undefined1 local_ef8 [16];
  SrcXprType local_cc0;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *local_cb8;
  vector<double,_std::allocator<double>_> local_cb0;
  Matrix<double,_4,_4,_0,_4,_4> local_c98;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *local_c18;
  Matrix<double,_4,_4,_0,_4,_4> *local_c10;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *local_c08;
  undefined8 local_c00;
  undefined1 local_bf8 [16];
  double local_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  undefined1 local_bc8 [16];
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  double local_af8;
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  double local_ac0;
  double local_ab8;
  Scalar local_ab0;
  Scalar local_aa8;
  double local_aa0;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_a98;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_a80;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_a68;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_a50;
  undefined1 local_a38 [64];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  double local_9a8;
  Matrix<double,_6,_6,_0,_6,_6> local_998;
  Matrix<double,_3,_3,_0,_3,_3> local_878;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  Matrix<double,_4,_4,_0,_4,_4> *local_7f8;
  Matrix<double,_3,_3,_0,_3,_3> *local_7f0;
  Matrix<double,_4,_4,_0,_4,_4> *local_7e8;
  undefined8 local_7e0;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  undefined1 local_798 [16];
  double local_788;
  double dStack_780;
  undefined1 local_778 [16];
  double local_768;
  double dStack_760;
  undefined1 local_758 [16];
  double local_748;
  double dStack_740;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  double local_6e8;
  double dStack_6e0;
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  double local_668;
  double dStack_660;
  double local_658;
  undefined8 uStack_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  double local_618;
  double dStack_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double dStack_5c0;
  undefined1 local_5b8 [16];
  double local_5a8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_598;
  Matrix<double,_4,_4,_0,_4,_4> local_518;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> local_498;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 local_440;
  double dStack_438;
  double local_430;
  double dStack_428;
  undefined8 local_420;
  Matrix<double,_6,_6,_0,_6,_6> local_418;
  Matrix<double,_4,_4,_0,_4,_4> local_2f8;
  Matrix<double,_3,_1,_0,_3,_1> local_278;
  Matrix<double,_3,_1,_0,_3,_1> local_258;
  Matrix<double,_5,_1,_0,_5,_1> local_240;
  Matrix<double,_6,_1,_0,_6,_1> local_218;
  Matrix<double,_6,_1,_0,_6,_1> local_1e8;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_1b8;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_138;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar50 = 0;
  ppVar6 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar6) &&
     ((ulong)((long)(lPair->
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81)) {
    poVar42 = std::operator<<((ostream *)&std::cerr,
                              "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                             );
    std::endl<char,std::char_traits<char>>(poVar42);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = (ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = (ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = (ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = (ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[1];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[2];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[3];
  getPluckerCoord<double>(&local_a50,&local_b8);
  ppVar6 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar6->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar6->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar6->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar6->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&local_a68,&local_138);
  ppVar6 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar6[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar6[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar6[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar6[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar6[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar6[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar6[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar6[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar6[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar6[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar6[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar6[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar6[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar6[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar6[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar6[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&local_a80,&local_1b8);
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       ((local_a50.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       local_a50.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  getPredefinedTransformations1M1Q<double>(&local_a98,&local_1e8,&local_218);
  lVar45 = 0x10;
  pMVar46 = local_a98.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar47 = &local_598;
  for (lVar43 = 0x10; lVar43 != 0; lVar43 = lVar43 + -1) {
    (pMVar47->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar46->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar46 = (pointer)((long)pMVar46 + ((ulong)bVar50 * -2 + 1) * 8);
    pMVar47 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar47 + ((ulong)bVar50 * -2 + 1) * 8);
  }
  pMVar46 = local_a98.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pMVar47 = &local_2f8;
  for (lVar43 = 0x10; lVar43 != 0; lVar43 = lVar43 + -1) {
    (pMVar47->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar46->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar46 = (pointer)((long)pMVar46 + ((ulong)bVar50 * -2 + 1) * 8);
    pMVar47 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar47 + ((ulong)bVar50 * -2 + 1) * 8);
  }
  pdVar40 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
       0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x15] = 1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 1.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x23] = 1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
       0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x15] = 1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 1.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x23] = 1.0;
  do {
    dVar1 = *(double *)((long)local_5a8 + lVar45 + 8);
    ((plain_array<double,_36,_0,_16> *)(pdVar40 + -2))->array[0] =
         *(double *)((long)local_5a8 + lVar45);
    pdVar40[-1] = dVar1;
    *pdVar40 = *(double *)
                ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar45);
    lVar45 = lVar45 + 0x20;
    pdVar40 = pdVar40 + 6;
  } while (lVar45 != 0x70);
  lVar43 = 8;
  pdVar40 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  do {
    pdVar40[-1] = *(double *)((long)local_5a8 + lVar43 + 8);
    dVar1 = *(double *)
             ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar43 + 8);
    *pdVar40 = *(double *)
                ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar43);
    pdVar40[1] = dVar1;
    pdVar40 = pdVar40 + 6;
    lVar43 = lVar43 + 0x20;
  } while (lVar43 != 0x68);
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_878,&local_258);
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       + 3;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_598;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       1.97626258336499e-323;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       &local_418;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
  m_value = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6
  ;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_878;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            (&local_498,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_c98,(assign_op<double,_double> *)&local_518,(type)0x0);
  lVar43 = 0x10;
  pdVar40 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  do {
    dVar1 = *(double *)
             ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar43 + -8);
    ((plain_array<double,_36,_0,_16> *)(pdVar40 + -2))->array[0] =
         *(double *)
          ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array + lVar43 + -0x10);
    pdVar40[-1] = dVar1;
    *pdVar40 = *(double *)
                ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar43);
    lVar43 = lVar43 + 0x20;
    pdVar40 = pdVar40 + 6;
  } while (lVar43 != 0x70);
  lVar43 = 8;
  pdVar40 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  do {
    pdVar40[-1] = *(double *)
                   ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar43 + -8);
    dVar1 = *(double *)
             ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar43 + 8);
    *pdVar40 = *(double *)
                ((long)local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar43);
    pdVar40[1] = dVar1;
    pdVar40 = pdVar40 + 6;
    lVar43 = lVar43 + 0x20;
  } while (lVar43 != 0x68);
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_878,&local_278);
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       + 3;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_2f8;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       1.97626258336499e-323;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       &local_998;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
  m_value = 3;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6
  ;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_878;
  local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            (&local_498,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_c98,(assign_op<double,_double> *)&local_518,(type)0x0);
  dVar1 = ((local_a68.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar2 = ((local_a68.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar3 = ((local_a68.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar4 = ((local_a68.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  dVar5 = ((local_a68.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  dVar62 = ((local_a68.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  dVar64 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * dVar62 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x18] * dVar5 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x12] * dVar4 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xc] * dVar3 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[6] * dVar2 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * dVar1;
  dVar69 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar62 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar5 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar4 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar3 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar2 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar1;
  local_bd8 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x20] * dVar62 +
              local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1a] * dVar5 +
              local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x14] * dVar4 +
              local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xe] * dVar3 +
              local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[8] * dVar2 +
              local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[2] * dVar1;
  dVar74 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * dVar62 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * dVar5 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * dVar4 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * dVar3 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * dVar2 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * dVar1;
  dVar75 = dVar62 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar5 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x1c] +
           dVar4 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x16] +
           dVar3 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x10] +
           dVar2 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar1 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  local_7d8 = dVar62 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x23] +
              dVar5 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[0x1d] +
              dVar4 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[0x17] +
              dVar3 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[0x11] +
              dVar2 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[0xb] +
              dVar1 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[5];
  dVar1 = local_a68.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar2 = local_a68.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar3 = local_a68.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar4 = local_a68.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar5 = local_a68.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar62 = local_a68.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_be8 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1e] * dVar62 +
              local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x18] * dVar5 +
              local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x12] * dVar4 +
              local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xc] * dVar3 +
              local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] * dVar2 +
              local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] * dVar1;
  dVar70 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar1;
  dVar72 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar1;
  local_a38._32_8_ =
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [0x21] * dVar62 +
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [0x1b] * dVar5 +
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [0x15] * dVar4 +
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [0xf] * dVar3 +
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [9] * dVar2 +
       local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [3] * dVar1;
  dVar76 = dVar62 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar5 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x1c] +
           dVar4 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x16] +
           dVar3 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x10] +
           dVar2 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar1 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  dVar80 = dVar62 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x23] +
           dVar5 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x1d] +
           dVar4 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x17] +
           dVar3 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x11] +
           dVar2 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0xb] +
           dVar1 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
  dVar1 = ((local_a80.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar2 = ((local_a80.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar3 = ((local_a80.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar4 = ((local_a80.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  dVar5 = ((local_a80.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  dVar62 = ((local_a80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  dVar73 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * dVar62 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x18] * dVar5 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x12] * dVar4 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xc] * dVar3 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[6] * dVar2 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * dVar1;
  dStack_760 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1f] * dVar62 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x19] * dVar5 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x13] * dVar4 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xd] * dVar3 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[7] * dVar2 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[1] * dVar1;
  dVar65 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar62 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar5 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar4 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar3 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar2 +
           local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar1;
  dStack_5c0 = local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x21] * dVar62 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1b] * dVar5 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x15] * dVar4 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xf] * dVar3 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[9] * dVar2 +
               local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[3] * dVar1;
  dVar77 = dVar62 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar5 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x1c] +
           dVar4 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x16] +
           dVar3 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x10] +
           dVar2 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar1 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  dVar81 = dVar62 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x23] +
           dVar5 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x1d] +
           dVar4 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x17] +
           dVar3 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0x11] +
           dVar2 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0xb] +
           dVar1 * local_418.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
  dVar1 = local_a80.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar2 = local_a80.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar3 = local_a80.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar4 = local_a80.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar5 = local_a80.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar62 = local_a80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  dVar83 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x18] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x12] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xc] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[6] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * dVar1;
  dVar84 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar1;
  dVar66 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar1;
  dVar71 = local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * dVar62 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * dVar5 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * dVar4 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * dVar3 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * dVar2 +
           local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * dVar1;
  local_5a8[0] = dVar62 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x22] +
                 dVar5 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x1c] +
                 dVar4 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x16] +
                 dVar3 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x10] +
                 dVar2 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[10] +
                 dVar1 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[4];
  local_5a8[1] = dVar62 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x23] +
                 dVar5 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x1d] +
                 dVar4 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x17] +
                 dVar3 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0x11] +
                 dVar2 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[0xb] +
                 dVar1 * local_998.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[5];
  uVar54 = SUB84(dVar69,0);
  uVar57 = (uint)((ulong)dVar69 >> 0x20);
  uVar51 = (undefined4)((ulong)dVar74 >> 0x20);
  dVar1 = dVar64 + dVar64;
  local_ef8._0_8_ = dVar1 * dStack_5c0;
  auVar7._8_4_ = uVar54;
  auVar7._0_8_ = local_ef8._0_8_;
  auVar7._12_4_ = uVar57;
  dVar2 = dVar1 * dVar77;
  auVar8._8_4_ = uVar54;
  auVar8._0_8_ = dVar2;
  auVar8._12_4_ = uVar57;
  dVar90 = dVar69 + dVar69;
  dVar3 = dVar90 * dVar77;
  local_9f8._8_4_ = uVar54;
  local_9f8._0_8_ = dVar3;
  local_9f8._12_4_ = uVar57;
  dVar4 = dVar64 * 4.0;
  local_5b8._8_4_ = uVar54;
  local_5b8._0_8_ = dVar4 * dStack_5c0;
  local_5b8._12_4_ = uVar57;
  dVar5 = dVar69 * 4.0;
  local_5c8 = dStack_5c0 * dVar5;
  dVar62 = dVar64 * dVar73;
  local_6f8._8_4_ = uVar54;
  local_6f8._0_8_ = dVar62;
  local_6f8._12_4_ = uVar57;
  dVar63 = dVar69 * dVar73;
  local_6d8._8_4_ = uVar54;
  local_6d8._0_8_ = dVar63;
  local_6d8._12_4_ = uVar57;
  local_6c8._8_4_ = SUB84(dVar74,0);
  local_6c8._0_8_ = dVar74 * dVar73;
  local_6c8._12_4_ = uVar51;
  uVar55 = SUB84(local_7d8,0);
  uVar58 = (undefined4)((ulong)local_7d8 >> 0x20);
  dVar23 = dVar1 * dVar73;
  local_b78._8_4_ = uVar54;
  local_b78._0_8_ = dVar23;
  local_b78._12_4_ = uVar57;
  dVar24 = dVar74 + dVar74;
  dVar87 = dVar1 * dStack_760;
  dVar68 = dVar90 * dVar73;
  auVar9._8_4_ = uVar54;
  auVar9._0_8_ = dVar68;
  auVar9._12_4_ = uVar57;
  dVar91 = dVar90 * dStack_760;
  dVar25 = dVar75 + dVar75;
  local_5e8 = local_bd8 * -2.0 * dStack_760;
  local_5d8 = local_7d8 * -2.0 * dStack_760;
  dVar26 = -dVar4 * dStack_760;
  local_b68._8_4_ = uVar54;
  local_b68._0_8_ = dVar26;
  local_b68._12_4_ = uVar57 ^ 0x80000000;
  local_668 = dVar5 * dStack_760;
  local_ac0 = dVar75 * 4.0 * dStack_760;
  dVar78 = dStack_760 * -dVar64;
  dVar27 = dStack_760 * dVar74 * local_be8 * dVar83;
  local_798._8_4_ = SUB84(dStack_760,0);
  local_798._0_8_ = dVar27;
  local_798._12_4_ = (int)((ulong)dStack_760 >> 0x20);
  uVar52 = SUB84(dVar70,0);
  uVar53 = (undefined4)((ulong)dVar70 >> 0x20);
  dVar13 = local_be8 * dVar69 * dStack_760;
  local_778._8_4_ = uVar52;
  local_778._0_8_ = dVar13;
  local_778._12_4_ = uVar53;
  local_768 = dStack_760 * dVar75 * dVar70 * dVar83;
  dVar10 = local_bd8 * dStack_760 * dVar80 * dVar83;
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       local_7d8 * dStack_760 * dVar72 * dVar83;
  uVar56 = (undefined4)local_a38._32_8_;
  uVar59 = (undefined4)((ulong)local_a38._32_8_ >> 0x20);
  dVar28 = (double)local_a38._32_8_ * dVar23;
  local_738._8_4_ = uVar56;
  local_738._0_8_ = dVar28;
  local_738._12_4_ = uVar59;
  dVar29 = dVar28 * dVar83;
  local_678._8_4_ = uVar56;
  local_678._0_8_ = dVar29;
  local_678._12_4_ = uVar59;
  local_ef8._8_8_ = auVar7._8_8_;
  dVar30 = local_be8 * (double)local_ef8._0_8_ * dVar83;
  local_688._8_4_ = uVar52;
  local_688._0_8_ = dVar30;
  local_688._12_4_ = uVar53;
  dVar31 = local_be8 * dVar24 * dVar73;
  local_718._8_4_ = uVar52;
  local_718._0_8_ = dVar31;
  local_718._12_4_ = uVar53;
  dVar32 = dVar31 * dVar83;
  local_698._8_4_ = uVar52;
  local_698._0_8_ = dVar32;
  local_698._12_4_ = uVar53;
  local_788 = dVar70 * dVar87;
  local_748 = (double)local_a38._32_8_ * dVar87;
  dVar33 = dVar87 * dVar76 * dVar83;
  local_b08._8_4_ = uVar54;
  local_b08._0_8_ = dVar33;
  local_b08._12_4_ = uVar57;
  local_ef8._0_8_ = (double)local_ef8._0_8_ * dVar70;
  local_6b8 = local_be8 * dVar2;
  uStack_650 = auVar8._8_8_;
  local_658 = dVar2 * dVar70 * dVar83;
  dVar34 = local_be8 * dVar68;
  local_a38._56_4_ = uVar52;
  local_a38._48_8_ = dVar34;
  local_a38._60_4_ = uVar53;
  local_6e8 = (double)local_a38._32_8_ * dVar68;
  local_ba8 = dVar68 * dVar76;
  uStack_ba0 = auVar9._8_8_;
  dVar14 = local_ba8 * dVar83;
  local_648._8_4_ = uVar54;
  local_648._0_8_ = dVar14;
  local_648._12_4_ = uVar57;
  dVar15 = (double)local_a38._32_8_ * dVar91 * dVar83;
  local_638._8_4_ = uVar56;
  local_638._0_8_ = dVar15;
  local_638._12_4_ = uVar59;
  dVar67 = local_be8 * dVar90 * dStack_5c0;
  dVar16 = dVar90 * dStack_5c0 * dVar70 * dVar83;
  dVar17 = local_be8 * dVar3;
  local_728._8_4_ = uVar52;
  local_728._0_8_ = dVar17;
  local_728._12_4_ = uVar53;
  dVar18 = dVar17 * dVar83;
  local_628._8_4_ = uVar52;
  local_628._0_8_ = dVar18;
  local_628._12_4_ = uVar53;
  dVar82 = local_be8 * dVar24 * dStack_760;
  dVar19 = dVar24 * dStack_760 * dVar70 * dVar83;
  local_ad8._8_4_ = SUB84(dVar74,0);
  local_ad8._0_8_ = dVar19;
  local_ad8._12_4_ = uVar51;
  dVar86 = local_be8 * dVar25 * dVar73;
  local_708._8_4_ = uVar52;
  local_708._0_8_ = dVar86;
  local_708._12_4_ = uVar53;
  dVar20 = dVar25 * dVar73 * dVar70;
  local_b98._8_4_ = uVar55;
  local_b98._0_8_ = dVar20;
  local_b98._12_4_ = uVar58;
  dVar35 = dVar20 * dVar83;
  local_608._8_4_ = uVar55;
  local_608._0_8_ = dVar35;
  local_608._12_4_ = uVar58;
  dVar36 = local_be8 * dVar25 * dStack_760 * dVar83;
  local_5f8._8_4_ = uVar52;
  local_5f8._0_8_ = dVar36;
  local_5f8._12_4_ = uVar53;
  dVar37 = local_bd8 * -2.0 * dVar73 * dVar80 * dVar83;
  dVar21 = dVar25 * dStack_760 * dVar70;
  auVar12._8_4_ = uVar55;
  auVar12._0_8_ = dVar21;
  auVar12._12_4_ = uVar58;
  dVar22 = local_7d8 * -2.0 * dVar73 * dVar72 * dVar83;
  local_7c8 = local_748 * dVar83;
  local_758 = local_ef8;
  local_7a8 = dVar67 * dVar83;
  local_7b8 = dVar82 * dVar83;
  local_bb8 = dVar91 * dVar76 * dVar83;
  dVar11 = dVar5 * dVar77 * dVar70 * dVar83;
  local_b88._8_4_ = uVar54;
  local_b88._0_8_ = dVar11;
  local_b88._12_4_ = uVar57;
  local_618 = dVar64 * dVar81 * dVar70 * dVar66;
  dVar60 = dVar69 * dVar81 * local_be8 * dVar66;
  local_6a8 = dVar1 * dVar81 * local_be8 * dVar66;
  dVar66 = dVar81 * dVar90 * dVar70 * dVar66;
  local_b38._8_4_ = SUB84(dVar81,0);
  local_b38._0_8_ = dVar66;
  local_b38._12_4_ = (int)((ulong)dVar81 >> 0x20);
  dVar89 = (dVar75 * dVar73 * dVar70 * dVar84 +
           dVar69 * dVar77 * local_be8 * dVar84 +
           ((dVar13 * local_5a8[0] +
            dVar63 * dVar76 * dVar84 +
            ((dVar78 * dVar70 * local_5a8[0] +
             ((dVar74 * dVar73 * local_be8 * dVar84 +
              dVar69 * dStack_5c0 * local_be8 * dVar83 +
              local_be8 * dVar63 * dVar71 +
              (((double)local_a38._32_8_ * dVar78 * dVar83 +
               ((double)local_a38._32_8_ * dVar62 * dVar84 - dVar62 * dVar70 * dVar71)) -
              dStack_5c0 * dVar64 * dVar70 * dVar83)) - dVar27)) - dVar77 * dVar64 * dVar70 * dVar84
            )) - dVar69 * dStack_760 * dVar76 * dVar83)) - local_768;
  dVar62 = dVar70 * dVar23 * local_5a8[0];
  local_bf8._8_4_ = uVar52;
  local_bf8._0_8_ = dVar62;
  local_bf8._12_4_ = uVar53;
  dVar63 = local_be8 * dVar87 * local_5a8[0];
  local_b18._8_4_ = uVar52;
  local_b18._0_8_ = dVar63;
  local_b18._12_4_ = uVar53;
  dVar13 = dVar70 * dVar91 * local_5a8[0];
  dVar27 = local_be8 * dVar91 * local_5a8[0];
  local_bc8._8_4_ = uVar52;
  local_bc8._0_8_ = dVar27;
  local_bc8._12_4_ = uVar53;
  dVar92 = dVar64 * dVar65 * dVar70 * local_5a8[1];
  dVar79 = dVar69 * dVar65 * local_be8 * local_5a8[1];
  dVar93 = dVar1 * dVar65 * local_be8 * local_5a8[1];
  dVar65 = dVar65 * dVar90 * dVar70 * local_5a8[1];
  dVar61 = local_be8 * dVar23 * dVar71;
  dVar38 = dVar70 * dVar68 * dVar71;
  local_ae8._8_4_ = uVar52;
  local_ae8._0_8_ = dVar38;
  local_ae8._12_4_ = uVar53;
  dVar85 = local_be8 * dVar91 * dVar71;
  dVar68 = local_bd8 * dVar73 * dVar80 * dVar84;
  dVar78 = local_7d8 * dVar73 * dVar72 * dVar84;
  dVar88 = dVar23 * dVar76 * dVar84;
  dVar67 = dVar67 * dVar84;
  local_b58._8_4_ = uVar52;
  local_b58._0_8_ = dVar67;
  local_b58._12_4_ = uVar53;
  dVar81 = dVar24 * dVar73 * dVar70 * dVar84;
  dVar82 = dVar82 * dVar84;
  local_b48._8_4_ = uVar52;
  local_b48._0_8_ = dVar82;
  local_b48._12_4_ = uVar53;
  dVar86 = dVar86 * dVar84;
  dVar87 = dVar91 * dVar76 * dVar84;
  local_b28._8_4_ = uVar54;
  local_b28._0_8_ = dVar87;
  local_b28._12_4_ = uVar57;
  dVar3 = dVar3 * dVar70 * dVar84;
  uStack_af0 = auVar12._8_8_;
  local_af8 = dVar21 * dVar84;
  dVar91 = local_5e8 * dVar80 * dVar84;
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       local_5d8 * dVar72 * dVar84;
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       dVar21 * dVar83 +
       local_ac0 * local_be8 * dVar84 +
       ((dVar74 * -4.0 * dStack_760 * dVar70 * dVar84 +
        (((local_5c8 * dVar70 * dVar84 +
          local_bb8 +
          local_668 * (double)local_a38._32_8_ * dVar84 +
          ((((dVar5 * dVar73 * dVar70 * local_5a8[0] +
             dVar2 * dVar70 * dVar84 +
             dVar26 * dVar76 * dVar84 +
             local_788 * local_5a8[0] +
             dVar73 * dVar75 * 4.0 * local_be8 * dVar83 +
             local_7b8 +
             dVar74 * -4.0 * dVar73 * dVar70 * dVar83 +
             ((((double)local_a38._32_8_ * dVar5 * dVar73 * dVar83 +
               ((((double)local_ef8._0_8_ * dVar83 +
                 dVar4 * dStack_5c0 * local_be8 * dVar84 +
                 local_7c8 +
                 local_be8 * dVar26 * dVar71 +
                 (((local_be8 * dVar4 * dVar73 * local_5a8[0] + dVar70 * dVar23 * dVar71) -
                  dVar28 * dVar84) - dVar4 * dVar73 * dVar76 * dVar83)) -
                dVar77 * dVar4 * local_be8 * dVar83) - dVar34 * dVar71)) - local_7a8) -
             dVar31 * dVar84)) - local_ba8 * dVar84) - dVar27) - dVar70 * local_668 * dVar71)) -
         dVar17 * dVar84) - dVar11)) - dVar20 * dVar84);
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       (((((((((((((((((((((((dVar29 - dVar61) - dVar30) + dVar32 + dVar62) - dVar88) - dVar63) -
                        local_788 * dVar71) + local_748 * dVar84 + dVar33 +
                       (double)local_ef8._0_8_ * dVar84) - local_6b8 * dVar84) - local_658) -
                    dVar34 * local_5a8[0]) - dVar38) + local_6e8 * dVar84 + dVar14 + dVar85) -
                 dVar15) - dVar67) - dVar16) + dVar18) - dVar81) + dVar82 + dVar19 + dVar86 + dVar35
            ) - dVar36) + dVar93 + local_6a8) - dVar13) + dVar87) - dVar3) + dVar37 + local_af8 +
       dVar22 + dVar65 + dVar66 + dVar91 +
       local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       (((((((((((((((((((((((dVar61 - dVar29) + dVar30) - dVar32) - dVar62) + dVar88 + dVar63 +
                         local_788 * dVar71) - local_748 * dVar84) - dVar33) -
                      (double)local_ef8._0_8_ * dVar84) + local_6b8 * dVar84 + local_658 +
                      dVar34 * local_5a8[0] + dVar38) - local_6e8 * dVar84) - dVar14) - dVar85) +
                  dVar15 + dVar67 + dVar16) - dVar18) + dVar81) - dVar82) - dVar19) - dVar86) -
           dVar35) + dVar36 + dVar93 + local_6a8 + dVar13) - dVar87) + dVar3 + dVar37) - local_af8)
       + dVar22 + dVar65 + dVar66 + dVar91 +
       local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       ((((((dVar92 + dVar89 + local_618) - dVar79) - dVar60) - dVar68) + dVar10) - dVar78) +
       local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [4];
  local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       (((((dVar89 - dVar92) - local_618) + dVar79 + dVar60 + dVar68) - dVar10) + dVar78) -
       local_240.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [4];
  dStack_be0 = dVar70;
  dStack_bd0 = dVar74;
  dStack_bb0 = dVar69;
  local_a38._40_8_ = local_a38._32_8_;
  dStack_7d0 = local_7d8;
  dStack_7c0 = (double)local_a38._32_8_;
  dStack_7b0 = dVar70;
  dStack_7a0 = dVar70;
  dStack_780 = dVar70;
  dStack_740 = (double)local_a38._32_8_;
  dStack_6e0 = (double)local_a38._32_8_;
  dStack_6b0 = dVar70;
  dStack_6a0 = dVar69;
  dStack_660 = dVar69;
  dStack_610 = dVar69;
  dStack_5e0 = dVar74;
  dStack_5d0 = local_7d8;
  o4_roots<double>(&local_cb0,&local_240);
  if (local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar74 = dVar74 * local_be8;
    dVar2 = dVar64 * (double)local_a38._32_8_;
    dVar80 = dVar80 * local_bd8;
    dVar72 = dVar72 * local_7d8;
    dVar3 = -dVar64 * (double)local_a38._32_8_;
    dVar4 = -dVar90 * (double)local_a38._32_8_;
    dVar62 = -dVar25 * local_be8;
    dVar63 = dVar69 * local_be8;
    dVar68 = -dVar69 * local_be8;
    dVar5 = dVar1 * local_be8;
    uVar49 = 0;
    do {
      dVar10 = local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar49];
      local_aa0 = -(dVar62 * dVar10 +
                   dVar24 * dVar70 * dVar10 +
                   dVar4 * dVar10 +
                   dVar1 * dVar76 * dVar10 +
                   dVar72 * dVar10 * dVar10 +
                   dVar80 * dVar10 * dVar10 +
                   -dVar75 * dVar70 * dVar10 * dVar10 +
                   dVar76 * -dVar69 * dVar10 * dVar10 +
                   dVar10 * -dVar74 * dVar10 +
                   dVar3 * dVar10 * dVar10 +
                   dVar75 * dVar70 + dVar69 * dVar76 + dVar2 + dVar74 + dVar80 + dVar72) /
                  (dVar90 * dVar70 * dVar10 +
                  dVar5 * dVar10 +
                  dVar68 * dVar10 * dVar10 +
                  dVar64 * dVar70 * dVar10 * dVar10 + (dVar63 - dVar64 * dVar70));
      local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar10 * -2.0;
      dVar11 = 1.0 - dVar10 * dVar10;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_9e8;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_9e8._0_8_ = dVar11;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_c98,
                           (Scalar *)&local_878);
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (PointerType)0x0;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,(Scalar *)&local_498);
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = dVar10 + dVar10;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,(Scalar *)&local_518);
      local_a38._0_8_ = dVar11;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,(Scalar *)local_a38);
      local_cc0.m_xpr = (XprTypeNested)0x0;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,(Scalar *)&local_cc0);
      local_aa8 = 0.0;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,&local_aa8);
      local_ab0 = 0.0;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar41,&local_ab0);
      dVar10 = dVar10 * dVar10 + 1.0;
      local_ab8 = dVar10;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar41,&local_ab8);
      if (((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[3] +
           (long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] != 3) ||
         ((Matrix<double,_4,_4,_0,_4,_4> *)
          local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] != (Matrix<double,_4,_4,_0,_4,_4> *)0x3)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
        ;
LAB_001aa964:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
      }
      dVar10 = 1.0 / dVar10;
      dVar11 = (double)local_9e8._8_8_ * dVar10;
      local_9e8._8_4_ = SUB84(dVar11,0);
      local_9e8._0_8_ = (double)local_9e8._0_8_ * dVar10;
      local_9e8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      dVar11 = (double)local_9d8._8_8_ * dVar10;
      local_9d8._8_4_ = SUB84(dVar11,0);
      local_9d8._0_8_ = (double)local_9d8._0_8_ * dVar10;
      local_9d8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      dVar11 = (double)local_9c8._8_8_ * dVar10;
      local_9c8._8_4_ = SUB84(dVar11,0);
      local_9c8._0_8_ = (double)local_9c8._0_8_ * dVar10;
      local_9c8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      dVar11 = dVar10 * (double)local_9b8._8_8_;
      local_9b8._8_4_ = SUB84(dVar11,0);
      local_9b8._0_8_ = dVar10 * (double)local_9b8._0_8_;
      local_9b8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      local_9a8 = dVar10 * local_9a8;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_a38._0_8_ = 0.0;
      local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_a38;
      this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c98,
                        (Scalar *)&local_878);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,&local_aa0);
      if (((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[3] +
           (long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] != 3) ||
         ((Matrix<double,_4,_4,_0,_4,_4> *)
          local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] != (Matrix<double,_4,_4,_0,_4,_4> *)0x1)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
        ;
        goto LAB_001aa964;
      }
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (double *)0x3ff0000000000000;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
           (Matrix<double,_6,_6,_0,_6,_6> *)0x0;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
      m_value = 0x3ff0000000000000;
      local_458 = 0;
      uStack_450 = 0;
      local_498.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride
           = 0;
      uStack_460 = 0;
      local_448 = 0x3ff0000000000000;
      local_430 = 0.0;
      dStack_428 = 0.0;
      local_440 = 0;
      dStack_438 = 0.0;
      local_420 = 0x3ff0000000000000;
      lVar43 = 0x10;
      puVar44 = (undefined8 *)local_9d8;
      do {
        uVar39 = puVar44[-1];
        *(undefined8 *)
         ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43 + 0x70) = puVar44[-2];
        *(undefined8 *)
         ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43 + 0x78) = uVar39;
        *(undefined8 *)
         ((long)&local_498.
                 super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                 .m_data + lVar43) = *puVar44;
        puVar44 = puVar44 + 3;
        lVar43 = lVar43 + 0x20;
      } while (lVar43 != 0x70);
      dStack_438 = (double)local_a38._0_8_;
      local_430 = (double)local_a38._8_8_;
      dStack_428 = (double)local_a38._16_8_;
      local_cc0.m_xpr = &local_2f8;
      local_cb8 = &local_498;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_c98,&local_cc0,(assign_op<double,_double> *)&local_878);
      local_c18 = local_cb8;
      local_c08 = local_cb8;
      local_c00 = 4;
      lVar43 = 0;
      do {
        dVar10 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_data + lVar43);
        dVar11 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_rows.m_value + lVar43);
        dVar66 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_cols.m_value + lVar43);
        dVar13 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .m_xpr + lVar43);
        *(double *)
         ((long)local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar43) =
             dVar13 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xc] +
             dVar66 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8] +
             dVar11 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4] +
             dVar10 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0];
        *(double *)
         ((long)local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar43 + 8) =
             dVar13 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xd] +
             dVar66 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9] +
             dVar11 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5] +
             dVar10 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
        dVar10 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_data + lVar43);
        dVar11 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_rows.m_value + lVar43);
        dVar66 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_cols.m_value + lVar43);
        dVar13 = *(double *)
                  ((long)&(local_cb8->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .m_xpr + lVar43);
        *(double *)
         ((long)local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar43 + 0x10) =
             dVar13 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xe] +
             dVar66 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[10] +
             dVar11 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6] +
             dVar10 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar43 + 0x18) =
             dVar13 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf] +
             dVar66 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xb] +
             dVar11 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[7] +
             dVar10 * local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3];
        lVar43 = lVar43 + 0x20;
      } while (lVar43 != 0x80);
      local_7f8 = &local_598;
      local_7f0 = &local_878;
      local_7e8 = &local_598;
      local_7e0 = 4;
      lVar43 = 0;
      local_c10 = &local_c98;
      do {
        dVar10 = *(double *)
                  ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar43);
        dVar11 = *(double *)
                  ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar43 + 8);
        dVar66 = *(double *)
                  ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar43 + 0x10);
        dVar13 = *(double *)
                  ((long)local_598.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar43 + 0x18);
        *(double *)
         ((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43) =
             local_818 * dVar13 +
             local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar66 +
             local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar11 +
             local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar10;
        *(double *)
         ((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43 + 8) =
             dStack_810 * dVar13 +
             dStack_830 * dVar66 +
             local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar11 +
             local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar10;
        *(double *)
         ((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43 + 0x10) =
             dVar13 * local_808 +
             dVar66 * local_828 +
             dVar11 * local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] +
             dVar10 * local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar43 + 0x18) =
             dVar13 * dStack_800 +
             dVar66 * dStack_820 +
             dVar11 * local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] +
             dVar10 * local_878.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar43 = lVar43 + 0x20;
      } while (lVar43 != 0x80);
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[8];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[9];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[10];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xb];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xd];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xe];
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = local_c98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xf];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_518);
      }
      else {
        pMVar47 = &local_518;
        iVar48._M_current = __position._M_current;
        for (lVar43 = 0x10; lVar43 != 0; lVar43 = lVar43 + -1) {
          ((iVar48._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar47->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar47 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar47 + ((ulong)bVar50 * -2 + 1) * 8);
          iVar48._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar48._M_current + ((ulong)bVar50 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 < (ulong)((long)local_cb0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_cb0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_cb0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a98.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a98.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a98.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a98.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a80.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a80.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a80.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a80.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a68.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a68.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a68.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a68.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a50.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a50.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a50.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a50.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}